

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O3

SwapchainBuilder * __thiscall
vkb::SwapchainBuilder::add_fallback_present_mode
          (SwapchainBuilder *this,VkPresentModeKHR present_mode)

{
  iterator __position;
  VkPresentModeKHR local_c;
  
  __position._M_current =
       (this->info).desired_present_modes.
       super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->info).desired_present_modes.
      super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_c = present_mode;
    std::vector<VkPresentModeKHR,std::allocator<VkPresentModeKHR>>::
    _M_realloc_insert<VkPresentModeKHR_const&>
              ((vector<VkPresentModeKHR,std::allocator<VkPresentModeKHR>> *)
               &(this->info).desired_present_modes,__position,&local_c);
  }
  else {
    *__position._M_current = present_mode;
    (this->info).desired_present_modes.
    super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  return this;
}

Assistant:

SwapchainBuilder& SwapchainBuilder::add_fallback_present_mode(VkPresentModeKHR present_mode) {
    info.desired_present_modes.push_back(present_mode);
    return *this;
}